

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

Section __thiscall QDateTimeEdit::currentSection(QDateTimeEdit *this)

{
  Section s;
  Section SVar1;
  
  s = QDateTimeParser::sectionType
                ((int)*(undefined8 *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8 + 0x3d8
                );
  SVar1 = QDateTimeEditPrivate::convertToPublic(s);
  return SVar1;
}

Assistant:

QDateTimeEdit::Section QDateTimeEdit::currentSection() const
{
    Q_D(const QDateTimeEdit);
#ifdef QT_KEYPAD_NAVIGATION
    if (QApplicationPrivate::keypadNavigationEnabled() && d->focusOnButton)
        return NoSection;
#endif
    return QDateTimeEditPrivate::convertToPublic(d->sectionType(d->currentSectionIndex));
}